

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basisu_containers.h
# Opt level: O0

void __thiscall
basisu::vector<basisu::vector<basisu::gpu_image>_>::~vector
          (vector<basisu::vector<basisu::gpu_image>_> *this)

{
  vector<basisu::gpu_image> *in_RDI;
  size_t in_stack_ffffffffffffffe8;
  
  if (in_RDI->m_p != (gpu_image *)0x0) {
    scalar_type<basisu::vector<basisu::gpu_image>_>::destruct_array
              (in_RDI,in_stack_ffffffffffffffe8);
    free(in_RDI->m_p);
  }
  return;
}

Assistant:

inline ~vector()
      {
         if (m_p)
         {
            scalar_type<T>::destruct_array(m_p, m_size);
            free(m_p);
         }
      }